

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O0

PlainTextNetworkReader * __thiscall
notch::io::PlainTextNetworkReader::read_tag_abi_cxx11_(PlainTextNetworkReader *this,istream *in)

{
  istream *piVar1;
  void *in_RDX;
  istream *in_local;
  PlainTextNetworkReader *this_local;
  string *tag;
  
  std::__cxx11::string::string((string *)this);
  piVar1 = (istream *)std::istream::operator>>(in_RDX,std::ws<char,std::char_traits<char>>);
  piVar1 = std::operator>>(piVar1,(string *)this);
  std::istream::operator>>(piVar1,std::ws<char,std::char_traits<char>>);
  return this;
}

Assistant:

std::string read_tag(std::istream &in) {
        std::string tag;
        in >> std::ws >> tag >> std::ws;
        return tag;
    }